

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O2

void __thiscall chrono::turtlebot::TurtleBot::Initialize(TurtleBot *this)

{
  ChSystem *pCVar1;
  double *pdVar2;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  long local_4e8;
  ChVector<double> *local_4e0;
  shared_ptr<chrono::ChFunction_Const> const_speed_function_r;
  shared_ptr<chrono::ChFunction_Const> const_speed_function_l;
  ChQuaternion<double> local_4b8;
  shared_ptr<chrono::ChBody> local_498;
  shared_ptr<chrono::ChBody> local_488;
  double *local_478;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *local_470;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_468;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_448;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_438;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_428;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_418;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3f8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3e8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3d8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3c8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3a8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_398;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_388;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_378;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_358;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_348;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_338;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_328;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_318;
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_308;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_2f8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_2e8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_2b8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_2a8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_298;
  ChVector<double> v_2;
  ChVector<double> v_1;
  ChVector<double> v;
  ChQuaternion<double> z2x;
  ChQuaternion<double> z2y;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  shared_ptr<chrono::ChLinkMotorRotationSpeed> local_158;
  double adStack_148 [16];
  undefined1 local_c8 [16];
  double dStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  Turtlebot_Chassis::Initialize
            ((this->m_chassis).
             super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  Turtlebot_BottomPlate::Initialize
            ((this->m_bottom_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  Turtlebot_MiddlePlate::Initialize
            ((this->m_middle_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  Turtlebot_TopPlate::Initialize
            ((this->m_top_plate).
             super___shared_ptr<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 0x10) {
    Turtlebot_ActiveWheel::Initialize
              (*(Turtlebot_ActiveWheel **)
                ((long)&(((this->m_drive_wheels).
                          super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar4));
    Turtlebot_PassiveWheel::Initialize
              (*(Turtlebot_PassiveWheel **)
                ((long)&(((this->m_passive_wheels).
                          super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar4));
  }
  for (lVar4 = 0; lVar4 != 0x60; lVar4 = lVar4 + 0x10) {
    Turtlebot_Rod_Short::Initialize
              (*(Turtlebot_Rod_Short **)
                ((long)&(((this->m_1st_level_rods).
                          super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar4));
    Turtlebot_Rod_Short::Initialize
              (*(Turtlebot_Rod_Short **)
                ((long)&(((this->m_2nd_level_rods).
                          super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar4));
    Turtlebot_Rod_Long::Initialize
              (*(Turtlebot_Rod_Long **)
                ((long)&(((this->m_3rd_level_rods).
                          super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar4));
  }
  local_c8._0_8_ = -3.141592653589793;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&const_speed_function_l);
  local_c8._0_8_ = 0xc00921fb54442d18;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&const_speed_function_r);
  std::
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ::push_back(&this->m_motors_func,&const_speed_function_l);
  std::
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ::push_back(&this->m_motors_func,&const_speed_function_r);
  chrono::Q_from_AngX(1.5707963267948966);
  chrono::Q_from_AngY(-1.5707963267948966);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1e8,
             (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&((((this->m_drive_wheels).
                        super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->super_Turtlebot_Part + 0x28));
  local_488.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8._M_ptr;
  local_488.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_1e8._M_refcount._M_pi;
  local_1e8._M_ptr = (element_type *)0x0;
  local_1e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_298,
             &(((this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Turtlebot_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2a8,
             &(((this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Turtlebot_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_c8 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3fbd73eab367a0f9);
  pCVar1 = this->m_system;
  dStack_b8 = 0.03735;
  std::__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2b8,
             &const_speed_function_l.
              super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>);
  AddMotor((turtlebot *)&local_158,&local_488,(shared_ptr<chrono::ChBodyAuxRef> *)&local_298,
           (shared_ptr<chrono::ChBodyAuxRef> *)&local_2a8,pCVar1,(ChVector<double> *)local_c8,&z2y,
           (shared_ptr<chrono::ChFunction_Const> *)&local_2b8);
  std::
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
  ::emplace_back<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>
            ((vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
              *)&this->m_motors,&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.
              super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_298._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_488.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2c8,
             (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&((((this->m_passive_wheels).
                        super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->super_Turtlebot_Part + 0x28));
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2d8,
             &(((this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Turtlebot_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2e8,
             &(((this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Turtlebot_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_c8 = ZEXT816(0x3fbd73eab367a0f9);
  dStack_b8 = 0.02015;
  AddRevoluteJoint((shared_ptr<chrono::ChBodyAuxRef> *)&local_2c8,
                   (shared_ptr<chrono::ChBodyAuxRef> *)&local_2d8,
                   (shared_ptr<chrono::ChBodyAuxRef> *)&local_2e8,this->m_system,
                   (ChVector<double> *)local_c8,&z2x);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c8._M_refcount);
  p_Var3 = &local_1e8;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (p_Var3,(__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&((this->m_drive_wheels).
                             super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].
                             super___shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_Turtlebot_Part + 0x28));
  local_498.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8._M_ptr;
  local_498.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_1e8._M_refcount._M_pi;
  local_1e8._M_ptr = (element_type *)0x0;
  local_1e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_448,
             &(((this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Turtlebot_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2f8,
             &(((this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Turtlebot_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_c8 = vmovhpd_avx(ZEXT816(0) << 0x40,0xbfbd73eab367a0f9);
  pCVar1 = this->m_system;
  dStack_b8 = 0.03735;
  std::__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_308,
             &const_speed_function_r.
              super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>);
  AddMotor((turtlebot *)&local_158,&local_498,(shared_ptr<chrono::ChBodyAuxRef> *)&local_448,
           (shared_ptr<chrono::ChBodyAuxRef> *)&local_2f8,pCVar1,(ChVector<double> *)local_c8,&z2y,
           (shared_ptr<chrono::ChFunction_Const> *)&local_308);
  std::
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
  ::emplace_back<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>
            ((vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>>>
              *)&this->m_motors,&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.
              super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_308._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_448._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_498.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_318,
             (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&((this->m_passive_wheels).
                      super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super___shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_Turtlebot_Part + 0x28));
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_328,
             &(((this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Turtlebot_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_338,
             &(((this->m_chassis).
                super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Turtlebot_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_4e0 = (ChVector<double> *)local_c8;
  local_c8 = ZEXT816(0xbfbd73eab367a0f9);
  dStack_b8 = 0.02015;
  AddRevoluteJoint((shared_ptr<chrono::ChBodyAuxRef> *)&local_318,
                   (shared_ptr<chrono::ChBodyAuxRef> *)&local_328,
                   (shared_ptr<chrono::ChBodyAuxRef> *)&local_338,this->m_system,local_4e0,&z2x);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_328._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_318._M_refcount);
  pdVar2 = adStack_148;
  local_c8._8_8_ = 0x3fbeb313be22e5de;
  local_c8._0_8_ = 0xbfaced916872b021;
  dStack_b8 = 0.09615;
  uStack_b0 = 0x3fab645a1cac0831;
  uStack_a8 = 0x3fbeb313be22e5de;
  uStack_a0 = 0x3fb89d495182a993;
  uStack_98 = 0x3fbe5604189374bc;
  uStack_90 = 0x3fb4f8b588e368f1;
  local_88 = 0x3fb89d495182a993;
  uStack_80 = 0x3fbe5604189374bc;
  uStack_78 = 0xbfb4f8b588e368f1;
  uStack_70 = 0x3fb89d495182a993;
  uStack_68 = 0x3fab645a1cac0831;
  uStack_60 = 0xbfbeb313be22e5de;
  uStack_58 = 0x3fb89d495182a993;
  uStack_50 = 0xbfaced916872b021;
  local_158.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0xbfba9bcfd4bf0996;
  local_158.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fb91148fd9fd36f;
  adStack_148[0] = 0.15015;
  adStack_148[1] = -0.0015;
  adStack_148[2] = 0.16192;
  adStack_148[3] = 0.15015;
  adStack_148[4] = 0.0687;
  adStack_148[5] = 0.13132;
  local_48 = 0xbfbeb313be22e5de;
  uStack_40 = 0x3fb89d495182a993;
  adStack_148[6] = 0.15015;
  adStack_148[7] = 0.0687;
  adStack_148[8] = -0.13132;
  adStack_148[9] = 0.15015;
  adStack_148[10] = -0.0015;
  adStack_148[0xb] = -0.16192;
  adStack_148[0xc] = 0.15015;
  adStack_148[0xd] = -0.10394;
  local_1e8._M_ptr = (element_type *)0xbfba9bcfd4bf0996;
  local_1e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fb91148fd9fd36f;
  uStack_1d8 = 0x3fca631f8a0902de;
  uStack_1d0 = 0xbf589374bc6a7efa;
  uStack_1c8 = 0x3fc4b9cb6848beb6;
  uStack_1c0 = 0x3fca631f8a0902de;
  uStack_1b8 = 0x3fb19652bd3c3611;
  uStack_1b0 = 0x3fc0cf1800a7c5ac;
  adStack_148[0xe] = -0.09792;
  adStack_148[0xf] = 0.15015;
  local_1a8 = 0x3fca631f8a0902de;
  uStack_1a0 = 0x3fb19652bd3c3611;
  uStack_198 = 0xbfc0cf1800a7c5ac;
  uStack_190 = 0x3fca631f8a0902de;
  uStack_188 = 0xbf589374bc6a7efa;
  uStack_180 = 0xbfc4b9cb6848beb6;
  uStack_178 = 0x3fca631f8a0902de;
  uStack_170 = 0xbfba9bcfd4bf0996;
  local_168 = 0xbfb91148fd9fd36f;
  uStack_160 = 0x3fca631f8a0902de;
  for (local_4e8 = 0; local_4e8 != 0x60; local_4e8 = local_4e8 + 0x10) {
    v.m_data[0] = local_4e0->m_data[0] + 0.0;
    v.m_data[1] = local_4e0->m_data[1] + 0.0;
    v.m_data[2] = local_4e0->m_data[2] + 0.05;
    v_1.m_data[0] = pdVar2[-2] + 0.0;
    v_1.m_data[1] = pdVar2[-1] + 0.0;
    v_1.m_data[2] = *pdVar2 + 0.05;
    v_2.m_data[0] = (double)p_Var3->_M_ptr + 0.0;
    v_2.m_data[1] = (double)(p_Var3->_M_refcount)._M_pi + 0.0;
    v_2.m_data[2] = (double)p_Var3[1]._M_ptr + 0.2;
    local_478 = pdVar2;
    local_470 = p_Var3;
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_458,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(((this->m_1st_level_rods).
                                   super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + local_4e8) + 0x28));
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_348,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_358,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    local_4b8.m_data[0] = 1.0;
    local_4b8.m_data[3] = 0.0;
    local_4b8.m_data[1] = 0.0;
    local_4b8.m_data[2] = 0.0;
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)&local_458,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_348,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_358,this->m_system,local_4e0,&local_4b8)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_358._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_348._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_458._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_368,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(((this->m_1st_level_rods).
                                   super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + local_4e8) + 0x28));
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_468,
               &(((this->m_bottom_plate).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_378,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    local_4b8.m_data[0] = 1.0;
    local_4b8.m_data[3] = 0.0;
    local_4b8.m_data[1] = 0.0;
    local_4b8.m_data[2] = 0.0;
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)&local_368,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_468,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_378,this->m_system,&v,&local_4b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_468._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_388,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(((this->m_2nd_level_rods).
                                   super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + local_4e8) + 0x28));
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_398,
               &(((this->m_bottom_plate).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_3a8,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    local_4b8.m_data[0] = 1.0;
    local_4b8.m_data[3] = 0.0;
    local_4b8.m_data[1] = 0.0;
    local_4b8.m_data[2] = 0.0;
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)&local_388,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_398,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_3a8,this->m_system,local_4e0,&local_4b8)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_398._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_388._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_3b8,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(((this->m_2nd_level_rods).
                                   super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + local_4e8) + 0x28));
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_3c8,
               &(((this->m_middle_plate).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_3d8,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    local_4b8.m_data[0] = 1.0;
    local_4b8.m_data[3] = 0.0;
    local_4b8.m_data[1] = 0.0;
    local_4b8.m_data[2] = 0.0;
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)&local_3b8,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_3c8,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_3d8,this->m_system,&v_1,&local_4b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3d8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_3e8,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(((this->m_3rd_level_rods).
                                   super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + local_4e8) + 0x28));
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_3f8,
               &(((this->m_middle_plate).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_408,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    p_Var3 = local_470;
    local_4b8.m_data[0] = 1.0;
    local_4b8.m_data[3] = 0.0;
    local_4b8.m_data[1] = 0.0;
    local_4b8.m_data[2] = 0.0;
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)&local_3e8,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_3f8,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_408,this->m_system,
                 (ChVector<double> *)local_470,&local_4b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_408._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3f8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e8._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_418,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(((this->m_3rd_level_rods).
                                   super__Vector_base<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + local_4e8) + 0x28));
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_428,
               &(((this->m_top_plate).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_438,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Turtlebot_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    local_4b8.m_data[0] = 1.0;
    local_4b8.m_data[3] = 0.0;
    local_4b8.m_data[1] = 0.0;
    local_4b8.m_data[2] = 0.0;
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)&local_418,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_428,
                 (shared_ptr<chrono::ChBodyAuxRef> *)&local_438,this->m_system,&v_2,&local_4b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_438._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_428._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_418._M_refcount);
    local_4e0 = local_4e0 + 1;
    p_Var3 = (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
             &p_Var3[1]._M_refcount;
    pdVar2 = local_478 + 3;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&const_speed_function_r.
              super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&const_speed_function_l.
              super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void TurtleBot::Initialize() {
    m_chassis->Initialize();
    m_bottom_plate->Initialize();
    m_middle_plate->Initialize();
    m_top_plate->Initialize();
    for (int i = 0; i < 2; i++) {
        m_drive_wheels[i]->Initialize();
        m_passive_wheels[i]->Initialize();
    }

    for (int i = 0; i < 6; i++) {
        m_1st_level_rods[i]->Initialize();
        m_2nd_level_rods[i]->Initialize();
        m_3rd_level_rods[i]->Initialize();
    }

    // redeclare necessary location variables
    double dwx = 0;
    double dwy = 0.11505;
    double dwz = 0.03735;

    double pwx = 0.11505;
    double pwy = 0;
    double pwz = 0.02015;

    double rod_s_0_x = -0.0565;
    double rod_s_0_y = 0.11992;
    double rod_s_0_z = 0.09615;

    double rod_s_1_x = 0.0535;
    double rod_s_1_y = 0.11992;
    double rod_s_1_z = 0.09615;

    double rod_s_2_x = 0.11850;
    double rod_s_2_y = 0.08192;
    double rod_s_2_z = 0.09615;

    double rod_s_3_x = 0.11850;
    double rod_s_3_y = -0.08192;
    double rod_s_3_z = 0.09615;

    double rod_s_4_x = 0.0535;
    double rod_s_4_y = -0.11992;
    double rod_s_4_z = 0.09615;

    double rod_s_5_x = -0.0565;
    double rod_s_5_y = -0.11992;
    double rod_s_5_z = 0.09615;

    double rod_m_0_x = -0.10394;
    double rod_m_0_y = 0.09792;
    double rod_m_0_z = 0.15015;

    double rod_m_1_x = -0.0015;
    double rod_m_1_y = 0.16192;
    double rod_m_1_z = 0.15015;

    double rod_m_2_x = 0.0687;
    double rod_m_2_y = 0.13132;
    double rod_m_2_z = 0.15015;

    double rod_m_3_x = 0.0687;
    double rod_m_3_y = -0.13132;
    double rod_m_3_z = 0.15015;

    double rod_m_4_x = -0.0015;
    double rod_m_4_y = -0.16192;
    double rod_m_4_z = 0.15015;

    double rod_m_5_x = -0.10394;
    double rod_m_5_y = -0.09792;
    double rod_m_5_z = 0.15015;

    double rod_u_0_x = -0.10394;
    double rod_u_0_y = 0.09792;
    double rod_u_0_z = 0.20615;

    double rod_u_1_x = -0.0015;
    double rod_u_1_y = 0.16192;
    double rod_u_1_z = 0.20615;

    double rod_u_2_x = 0.0687;
    double rod_u_2_y = 0.13132;
    double rod_u_2_z = 0.20615;

    double rod_u_3_x = 0.0687;
    double rod_u_3_y = -0.13132;
    double rod_u_3_z = 0.20615;

    double rod_u_4_x = -0.0015;
    double rod_u_4_y = -0.16192;
    double rod_u_4_z = 0.20615;

    double rod_u_5_x = -0.10394;
    double rod_u_5_y = -0.09792;
    double rod_u_5_z = 0.20615;

    // add motors and revolute joints on the active and passive wheels
    auto const_speed_function_l = chrono_types::make_shared<ChFunction_Const>(-CH_C_PI);
    auto const_speed_function_r = chrono_types::make_shared<ChFunction_Const>(-CH_C_PI);
    m_motors_func.push_back(const_speed_function_l);
    m_motors_func.push_back(const_speed_function_r);

    ChQuaternion<> z2y = Q_from_AngX(CH_C_PI_2);
    ChQuaternion<> z2x = Q_from_AngY(-CH_C_PI_2);

    m_motors.push_back(AddMotor(m_drive_wheels[0]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                                ChVector<>(dwx, dwy, dwz), z2y, const_speed_function_l));
    AddRevoluteJoint(m_passive_wheels[0]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                     ChVector<>(pwx, pwy, pwz), z2x);

    m_motors.push_back(AddMotor(m_drive_wheels[1]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                                ChVector<>(dwx, -dwy, dwz), z2y, const_speed_function_r));
    AddRevoluteJoint(m_passive_wheels[1]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                     ChVector<>(-pwx, pwy, pwz), z2x);

    // add fixity on all rods and plates
    // There are six constraints needed:
    // chassis -> bottom rods
    // bottom rods -> bottom plate
    // bottom plate -> middle rods
    // middle rods -> middle plate
    // middle plate -> top rods
    // top rods -> top plate

    ChVector<> bottom_rod_rel_pos[] = {ChVector<>(rod_s_0_x, rod_s_0_y, rod_s_0_z),  //
                                       ChVector<>(rod_s_1_x, rod_s_1_y, rod_s_1_z),  //
                                       ChVector<>(rod_s_2_x, rod_s_2_y, rod_s_2_z),  //
                                       ChVector<>(rod_s_3_x, rod_s_3_y, rod_s_3_z),  //
                                       ChVector<>(rod_s_4_x, rod_s_4_y, rod_s_4_z),  //
                                       ChVector<>(rod_s_5_x, rod_s_5_y, rod_s_5_z)};
    ChVector<> middle_rod_rel_pos[] = {ChVector<>(rod_m_0_x, rod_m_0_y, rod_m_0_z),  //
                                       ChVector<>(rod_m_1_x, rod_m_1_y, rod_m_1_z),  //
                                       ChVector<>(rod_m_2_x, rod_m_2_y, rod_m_2_z),  //
                                       ChVector<>(rod_m_3_x, rod_m_3_y, rod_m_3_z),  //
                                       ChVector<>(rod_m_4_x, rod_m_4_y, rod_m_4_z),  //
                                       ChVector<>(rod_m_5_x, rod_m_5_y, rod_m_5_z)};
    ChVector<> top_rod_rel_pos[] = {ChVector<>(rod_u_0_x, rod_u_0_y, rod_u_0_z),  //
                                    ChVector<>(rod_u_1_x, rod_u_1_y, rod_u_1_z),  //
                                    ChVector<>(rod_u_2_x, rod_u_2_y, rod_u_2_z),  //
                                    ChVector<>(rod_u_3_x, rod_u_3_y, rod_u_3_z),  //
                                    ChVector<>(rod_u_4_x, rod_u_4_y, rod_u_4_z),  //
                                    ChVector<>(rod_u_5_x, rod_u_5_y, rod_u_5_z)};

    for (int i = 0; i < 6; i++) {
        ChVector<> bottom_plate_rel_pos = bottom_rod_rel_pos[i] + ChVector<>(0, 0, 0.05);
        ChVector<> middle_plate_rel_pos = middle_rod_rel_pos[i] + ChVector<>(0, 0, 0.05);
        ChVector<> top_plate_rel_pos = top_rod_rel_pos[i] + ChVector<>(0, 0, 0.2);

        AddLockJoint(m_1st_level_rods[i]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                     bottom_rod_rel_pos[i], ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_1st_level_rods[i]->GetBody(), m_bottom_plate->GetBody(), m_chassis->GetBody(), m_system,
                     bottom_plate_rel_pos, ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_2nd_level_rods[i]->GetBody(), m_bottom_plate->GetBody(), m_chassis->GetBody(), m_system,
                     bottom_rod_rel_pos[i], ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_2nd_level_rods[i]->GetBody(), m_middle_plate->GetBody(), m_chassis->GetBody(), m_system,
                     middle_plate_rel_pos, ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_3rd_level_rods[i]->GetBody(), m_middle_plate->GetBody(), m_chassis->GetBody(), m_system,
                     top_rod_rel_pos[i], ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_3rd_level_rods[i]->GetBody(), m_top_plate->GetBody(), m_chassis->GetBody(), m_system,
                     top_plate_rel_pos, ChQuaternion<>(1, 0, 0, 0));
    }
}